

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  StatementSyntax *args_2;
  RandCaseItemSyntax *pRVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x598f26);
  args_2 = (StatementSyntax *)
           deepClone<slang::syntax::ExpressionSyntax>
                     ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0x598f63);
  deepClone<slang::syntax::StatementSyntax>
            ((StatementSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RandCaseItemSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::StatementSyntax&>
                     (this,(ExpressionSyntax *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RandCaseItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RandCaseItemSyntax>(
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.colon.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}